

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_long> __thiscall
kj::TreeIndex<kj::_::(anonymous_namespace)::StringLengthCompare>::
insert<kj::StringPtr,unsigned_long>
          (TreeIndex<kj::_::(anonymous_namespace)::StringLengthCompare> *this,
          ArrayPtr<kj::StringPtr> table,size_t pos,unsigned_long *params)

{
  bool bVar1;
  size_t index;
  ArrayPtr<const_char> *pAVar2;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar3;
  StringLengthCompare *this_00;
  unsigned_long *in_R9;
  Maybe<unsigned_long> MVar4;
  size_t local_88;
  char *local_80;
  size_t local_78;
  SearchKeyImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:1530:22)>
  local_70;
  undefined1 local_50 [8];
  Iterator iter;
  unsigned_long *params_local;
  size_t pos_local;
  TreeIndex<kj::_::(anonymous_namespace)::StringLengthCompare> *this_local;
  ArrayPtr<kj::StringPtr> table_local;
  
  this_local = (TreeIndex<kj::_::(anonymous_namespace)::StringLengthCompare> *)table.size_;
  this_00 = (StringLengthCompare *)table.ptr;
  iter._16_8_ = in_R9;
  table_local.ptr = (StringPtr *)pos;
  table_local.size_ = (size_t)this;
  searchKey<kj::StringPtr,unsigned_long>
            (&local_70,(TreeIndex<kj::_::(anonymous_namespace)::StringLengthCompare> *)this_00,
             (ArrayPtr<kj::StringPtr> *)&this_local,in_R9);
  kj::_::BTreeImpl::insert
            ((Iterator *)local_50,(BTreeImpl *)(this_00 + 8),&local_70.super_SearchKey);
  bVar1 = kj::_::BTreeImpl::Iterator::isEnd((Iterator *)local_50);
  if (!bVar1) {
    index = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_50);
    pAVar2 = &ArrayPtr<kj::StringPtr>::operator[]((ArrayPtr<kj::StringPtr> *)&this_local,index)->
              content;
    local_80 = pAVar2->ptr;
    local_78 = pAVar2->size_;
    bVar1 = kj::_::anon_unknown_0::StringLengthCompare::matches
                      (this_00,(StringPtr)*pAVar2,*(size_t *)iter._16_8_);
    if (bVar1) {
      local_88 = kj::_::BTreeImpl::Iterator::operator*((Iterator *)local_50);
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_88);
      aVar3 = extraout_RDX;
      goto LAB_00227369;
    }
  }
  kj::_::BTreeImpl::Iterator::insert((Iterator *)local_50,(BTreeImpl *)(this_00 + 8),(uint)params);
  Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
  aVar3 = extraout_RDX_00;
LAB_00227369:
  MVar4.ptr.field_1.value = aVar3.value;
  MVar4.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar4.ptr;
}

Assistant:

kj::Maybe<size_t> insert(kj::ArrayPtr<Row> table, size_t pos, Params&&... params) {
    auto iter = impl.insert(searchKey(table, params...));

    if (!iter.isEnd() && cb.matches(table[*iter], params...)) {
      return *iter;
    } else {
      iter.insert(impl, pos);
      return kj::none;
    }
  }